

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TtCountOnesInCofsSimple(word *pTruth,int nVars,int *pStore)

{
  undefined1 auVar1 [16];
  uint uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong uVar14;
  long lVar19;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar18;
  int iVar20;
  undefined1 auVar17 [16];
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  
  Abc_TtCountOnesInCofs(pTruth,nVars,pStore);
  bVar3 = (byte)nVars;
  uVar2 = 1 << (bVar3 - 6 & 0x1f);
  if (nVars < 7) {
    uVar2 = 1;
  }
  if (nVars < 6) {
    uVar5 = 1 << (bVar3 & 0x1f);
    uVar14 = (ulong)uVar5;
    uVar8 = ~(-1L << ((byte)uVar5 & 0x3f)) & *pTruth;
    if ((uint)nVars < 6) {
      uVar4 = uVar5 * 2;
      uVar7 = (ulong)uVar4;
      uVar6 = 0x40;
      if (0x40 < uVar7) {
        uVar6 = uVar7;
      }
      uVar7 = ((uVar6 - uVar7) - (ulong)(nVars != 5) >> (bVar3 & 0x3f)) + (ulong)(nVars != 5);
      lVar19 = (ulong)uVar5 * 2;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar8;
      auVar12._8_4_ = (int)uVar7;
      auVar12._0_8_ = uVar7;
      auVar12._12_4_ = (int)(uVar7 >> 0x20);
      uVar6 = 0xfffffffffffffffe;
      do {
        auVar10 = auVar9;
        auVar16._8_4_ = (int)uVar8;
        auVar16._0_8_ = uVar8;
        auVar16._12_4_ = (int)(uVar8 >> 0x20);
        auVar11._8_8_ = auVar16._8_8_ << lVar19;
        auVar11._0_8_ = uVar8 << uVar14;
        auVar9 = auVar11 | auVar10;
        uVar14 = uVar14 + uVar4;
        lVar19 = lVar19 + (ulong)uVar4;
        uVar6 = uVar6 + 2;
      } while ((uVar7 & 0xfffffffffffffffe) != uVar6);
      auVar15._8_4_ = (int)uVar6;
      auVar15._0_8_ = uVar6;
      auVar15._12_4_ = (int)(uVar6 >> 0x20);
      auVar12 = auVar12 ^ _DAT_0093d220;
      auVar16 = (auVar15 | _DAT_0093d210) ^ _DAT_0093d220;
      iVar21 = -(uint)(auVar12._0_4_ < auVar16._0_4_);
      iVar22 = -(uint)(auVar12._4_4_ < auVar16._4_4_);
      iVar23 = -(uint)(auVar12._8_4_ < auVar16._8_4_);
      iVar24 = -(uint)(auVar12._12_4_ < auVar16._12_4_);
      iVar18 = -(uint)(auVar16._4_4_ == auVar12._4_4_);
      iVar20 = -(uint)(auVar16._12_4_ == auVar12._12_4_);
      auVar13._4_4_ = iVar18;
      auVar13._0_4_ = iVar18;
      auVar13._8_4_ = iVar20;
      auVar13._12_4_ = iVar20;
      auVar1._4_4_ = iVar21;
      auVar1._0_4_ = iVar21;
      auVar1._8_4_ = iVar23;
      auVar1._12_4_ = iVar23;
      auVar17._4_4_ = iVar22;
      auVar17._0_4_ = iVar22;
      auVar17._8_4_ = iVar24;
      auVar17._12_4_ = iVar24;
      auVar17 = auVar17 | auVar13 & auVar1;
      auVar9 = ~auVar17 & auVar9 | auVar10 & auVar17;
      uVar8 = auVar9._8_8_ | auVar9._0_8_;
    }
    if (*pTruth != uVar8) {
      __assert_fail("*pTruth == nTruth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
    }
  }
  if ((int)uVar2 < 1) {
    iVar18 = 0;
  }
  else {
    uVar14 = 0;
    iVar18 = 0;
    do {
      uVar8 = pTruth[uVar14];
      if (uVar8 != 0) {
        uVar8 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
        uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
        uVar8 = (uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f;
        uVar8 = (uVar8 >> 8) + uVar8;
        lVar19 = (uVar8 >> 0x10) + uVar8;
        iVar18 = iVar18 + ((int)((ulong)lVar19 >> 0x20) + (int)lVar19 & 0xffU);
      }
      uVar14 = uVar14 + 1;
    } while (uVar2 != uVar14);
  }
  return iVar18;
}

Assistant:

int Abc_TtCountOnesInCofsSimple( word * pTruth, int nVars, int * pStore )
{
    Abc_TtCountOnesInCofs( pTruth, nVars, pStore );
    return Abc_TtCountOnesInTruth( pTruth, nVars );
}